

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O1

void __thiscall shaping_clipper::generate_spread_table(shaping_clipper *this)

{
  pointer pfVar1;
  pointer ppVar2;
  pointer piVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  double dVar13;
  float fVar14;
  int local_64;
  int local_50;
  
  iVar9 = this->num_psy_bins;
  if (0 < iVar9) {
    uVar5 = 1;
    lVar10 = 0;
    local_64 = 0;
    uVar11 = 0;
    do {
      iVar7 = uVar11 * 3 + 3;
      if (-1 < (int)(uVar11 * 3)) {
        iVar7 = uVar11 * 3;
      }
      iVar7 = iVar7 >> 2;
      iVar4 = (int)(uVar11 * 4 + 6) / 3;
      if (iVar9 <= iVar4) {
        iVar4 = iVar9;
      }
      fVar14 = 0.0;
      local_50 = (int)lVar10;
      if (iVar7 < iVar4) {
        iVar12 = iVar7;
        do {
          dVar13 = log(((double)iVar12 + 0.5) / ((double)(int)uVar11 + 0.5));
          dVar13 = exp((double)(ABS((float)dVar13) *
                               *(float *)(&DAT_0010b1e0 + (ulong)(iVar12 < (int)uVar11) * 4)));
          fVar14 = fVar14 + (float)dVar13;
          (this->spread_table).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start
          [this->num_psy_bins / 2 + iVar9 * local_50 + local_64 + iVar12] = (float)dVar13;
          iVar12 = iVar12 + 1;
        } while (iVar4 != iVar12);
      }
      if (iVar7 < iVar4) {
        pfVar1 = (this->spread_table).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = (long)iVar4 - (long)iVar7;
        iVar9 = iVar9 * local_50 + local_64 + iVar7 + this->num_psy_bins / 2;
        do {
          pfVar1[iVar9] = pfVar1[iVar9] / fVar14;
          iVar9 = iVar9 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      ppVar2 = (this->spread_table_range).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppVar2[lVar10].first = iVar7 - uVar11;
      ppVar2[lVar10].second = iVar4 - uVar11;
      if ((int)uVar11 < 2) {
        uVar6 = uVar11 + 1;
      }
      else {
        if ((uVar11 & uVar11 - 1) == 0) {
          uVar5 = uVar11 >> 1;
        }
        uVar6 = uVar5 + uVar11;
      }
      if ((int)uVar11 < (int)uVar6) {
        piVar3 = (this->spread_table_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = (long)(int)uVar11;
        do {
          piVar3[lVar8] = local_50;
          lVar8 = lVar8 + 1;
        } while ((int)uVar6 != lVar8);
      }
      lVar10 = lVar10 + 1;
      local_64 = -uVar6;
      iVar9 = this->num_psy_bins;
      uVar11 = uVar6;
    } while ((int)uVar6 < iVar9);
  }
  return;
}

Assistant:

void shaping_clipper::generate_spread_table() {
    // Calculate tent-shape function in log-log scale.

    // As an optimization, only consider bins close to "bin"
    // This reduces the number of multiplications needed in calculate_mask_curve
    // The masking contribution at faraway bins is negligeable

    // Another optimization to save memory and speed up the calculation of the
    // spread table is to calculate and store only 2 spread functions per
    // octave, and reuse the same spread function for multiple bins.
    int table_index = 0;
    int bin = 0;
    int increment = 1;
    while (bin < this->num_psy_bins) {
        float sum = 0;
        int base_idx = table_index * this->num_psy_bins;
        int start_bin = bin * 3 / 4;
        int end_bin = std::min(this->num_psy_bins, ((bin + 1) * 4 + 2) / 3);

        for (int j = start_bin; j < end_bin; j++) {
            // add 0.5 so i=0 doesn't get log(0)
            float rel_idx_log = std::abs(log((j + 0.5) / (bin + 0.5)));
            float value;
            if (j >= bin) {
                // mask up
                value = exp(-rel_idx_log * 40);
            } else {
                // mask down
                value = exp(-rel_idx_log * 80);
            }
            // the spreading function is centred in the row
            sum += value;
            this->spread_table[base_idx + this->num_psy_bins / 2 + j - bin] = value;
        }
        // now normalize it
        for (int j = start_bin; j < end_bin; j++) {
            this->spread_table[base_idx + this->num_psy_bins / 2 + j - bin] /= sum;
        }

        this->spread_table_range[table_index] = std::make_pair(start_bin - bin, end_bin - bin);

        int next_bin;
        if (bin <= 1) {
            next_bin = bin + 1;
        } else {
            if ((bin & (bin - 1)) == 0) {
                // power of 2
                increment = bin / 2;
            }
            next_bin = bin + increment;
        }

        // set bins between "bin" and "next_bin" to use this table_index
        for (int i = bin; i < next_bin; i++) {
            this->spread_table_index[i] = table_index;
        }

        bin = next_bin;
        table_index++;
    }
}